

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas.c
# Opt level: O0

int IDAGetDky(void *ida_mem,sunrealtype t,int k,N_Vector dky)

{
  int iVar1;
  long in_RDX;
  int in_ESI;
  IDAMem in_RDI;
  IDAMem in_XMM0_Qa;
  sunrealtype cjk_1 [6];
  sunrealtype cjk [6];
  int retval;
  int j;
  int i;
  sunrealtype psij_1;
  sunrealtype delt;
  sunrealtype tp;
  sunrealtype tfuzz;
  IDAMem IDA_mem;
  double adStack_c8 [6];
  double local_98 [8];
  int local_58;
  int local_54;
  sunrealtype local_50;
  double local_48;
  double local_40;
  double local_38;
  IDAMem local_30;
  long local_28;
  int local_1c;
  int local_4;
  
  if (in_RDI == (IDAMem)0x0) {
    IDAProcessError((IDAMem)0x0,-0x14,0xc1c,"IDAGetDky",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas.c"
                    ,"ida_mem = NULL illegal.");
    local_4 = -0x14;
  }
  else if (in_RDX == 0) {
    IDAProcessError(in_RDI,-0x1b,0xc25,"IDAGetDky",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas.c"
                    ,"dky = NULL illegal.");
    local_4 = -0x1b;
  }
  else if ((in_ESI < 0) || (in_RDI->ida_kused < in_ESI)) {
    IDAProcessError(in_RDI,-0x19,0xc2d,"IDAGetDky",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas.c"
                    ,"Illegal value for k.");
    local_4 = -0x19;
  }
  else {
    local_38 = in_RDI->ida_uround * 100.0 * (ABS(in_RDI->ida_tn) + ABS(in_RDI->ida_hh));
    if (in_RDI->ida_hh <= 0.0 && in_RDI->ida_hh != 0.0) {
      local_38 = -local_38;
    }
    local_40 = (in_RDI->ida_tn - in_RDI->ida_hused) - local_38;
    if (0.0 <= ((double)in_XMM0_Qa - local_40) * in_RDI->ida_hh) {
      for (local_54 = 0; local_54 < 6; local_54 = local_54 + 1) {
        local_98[local_54] = 0.0;
        adStack_c8[local_54] = 0.0;
      }
      local_48 = (double)in_XMM0_Qa - in_RDI->ida_tn;
      local_30 = in_RDI;
      local_28 = in_RDX;
      local_1c = in_ESI;
      for (local_54 = 0; local_54 <= local_1c; local_54 = local_54 + 1) {
        if (local_54 == 0) {
          local_98[0] = 1.0;
          local_50 = 0.0;
        }
        else {
          local_98[local_54] =
               (local_98[local_54 + -1] * (double)local_54) / local_30->ida_psi[local_54 + -1];
          local_50 = local_30->ida_psi[local_54 + -1];
        }
        for (local_58 = local_54 + 1; local_58 <= (local_30->ida_kused - local_1c) + local_54;
            local_58 = local_58 + 1) {
          local_98[local_58] =
               ((double)local_54 * adStack_c8[local_58 + -1] +
               local_98[local_58 + -1] * (local_48 + local_50)) / local_30->ida_psi[local_58 + -1];
          local_50 = local_30->ida_psi[local_58 + -1];
        }
        for (local_58 = local_54 + 1; local_58 <= (local_30->ida_kused - local_1c) + local_54;
            local_58 = local_58 + 1) {
          adStack_c8[local_58] = local_98[local_58];
        }
      }
      iVar1 = N_VLinearCombination
                        ((local_30->ida_kused - local_1c) + 1,local_98 + local_1c,
                         local_30->ida_phi + local_1c,local_28);
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else {
        local_4 = -0x1c;
      }
    }
    else {
      IDAProcessError(in_XMM0_Qa,(int)(in_RDI->ida_tn - in_RDI->ida_hused),(int)in_RDI->ida_tn,
                      (char *)in_RDI,(char *)0xffffffe6,(char *)0xc3a,"IDAGetDky",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas.c"
                      ,"Illegal value for t.t = %lg is not between tcur - hu = %lg and tcur = %lg.")
      ;
      local_4 = -0x1a;
    }
  }
  return local_4;
}

Assistant:

int IDAGetDky(void* ida_mem, sunrealtype t, int k, N_Vector dky)
{
  IDAMem IDA_mem;
  sunrealtype tfuzz, tp, delt, psij_1;
  int i, j, retval;
  sunrealtype cjk[MXORDP1];
  sunrealtype cjk_1[MXORDP1];

  /* Check ida_mem */
  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(IDA_PROFILER);

  if (dky == NULL)
  {
    IDAProcessError(IDA_mem, IDA_BAD_DKY, __LINE__, __func__, __FILE__,
                    MSG_NULL_DKY);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_BAD_DKY);
  }

  if ((k < 0) || (k > IDA_mem->ida_kused))
  {
    IDAProcessError(IDA_mem, IDA_BAD_K, __LINE__, __func__, __FILE__, MSG_BAD_K);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_BAD_K);
  }

  /* Check t for legality.  Here tn - hused is t_{n-1}. */

  tfuzz = HUNDRED * IDA_mem->ida_uround *
          (SUNRabs(IDA_mem->ida_tn) + SUNRabs(IDA_mem->ida_hh));
  if (IDA_mem->ida_hh < ZERO) { tfuzz = -tfuzz; }
  tp = IDA_mem->ida_tn - IDA_mem->ida_hused - tfuzz;
  if ((t - tp) * IDA_mem->ida_hh < ZERO)
  {
    IDAProcessError(IDA_mem, IDA_BAD_T, __LINE__, __func__, __FILE__, MSG_BAD_T,
                    t, IDA_mem->ida_tn - IDA_mem->ida_hused, IDA_mem->ida_tn);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_BAD_T);
  }

  /* Initialize the c_j^(k) and c_k^(k-1) */
  for (i = 0; i < MXORDP1; i++)
  {
    cjk[i]   = 0;
    cjk_1[i] = 0;
  }

  delt = t - IDA_mem->ida_tn;

  for (i = 0; i <= k; i++)
  {
    /* The below reccurence is used to compute the k-th derivative of the solution:
       c_j^(k) = ( k * c_{j-1}^(k-1) + c_{j-1}^{k} (Delta+psi_{j-1}) ) / psi_j

       Translated in indexes notation:
       cjk[j] = ( k*cjk_1[j-1] + cjk[j-1]*(delt+psi[j-2]) ) / psi[j-1]

       For k=0, j=1: c_1 = c_0^(-1) + (delt+psi[-1]) / psi[0]

       In order to be able to deal with k=0 in the same way as for k>0, the
       following conventions were adopted:
         - c_0(t) = 1 , c_0^(-1)(t)=0
         - psij_1 stands for psi[-1]=0 when j=1
                         for psi[j-2]  when j>1
    */
    if (i == 0)
    {
      cjk[i] = 1;
      psij_1 = 0;
    }
    else
    {
      /*                                                i       i-1          1
        c_i^(i) can be always updated since c_i^(i) = -----  --------  ... -----
                                                      psi_j  psi_{j-1}     psi_1
      */
      cjk[i] = cjk[i - 1] * i / IDA_mem->ida_psi[i - 1];
      psij_1 = IDA_mem->ida_psi[i - 1];
    }

    /* update c_j^(i) */

    /*j does not need to go till kused */
    for (j = i + 1; j <= IDA_mem->ida_kused - k + i; j++)
    {
      cjk[j] = (i * cjk_1[j - 1] + cjk[j - 1] * (delt + psij_1)) /
               IDA_mem->ida_psi[j - 1];
      psij_1 = IDA_mem->ida_psi[j - 1];
    }

    /* save existing c_j^(i)'s */
    for (j = i + 1; j <= IDA_mem->ida_kused - k + i; j++) { cjk_1[j] = cjk[j]; }
  }

  /* Compute sum (c_j(t) * phi(t)) */

  /* Sum j=k to j<=IDA_mem->ida_kused */
  retval = N_VLinearCombination(IDA_mem->ida_kused - k + 1, cjk + k,
                                IDA_mem->ida_phi + k, dky);
  if (retval != IDA_SUCCESS)
  {
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_VECTOROP_ERR);
  }

  SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
  return (IDA_SUCCESS);
}